

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

QVersionNumber QVersionNumber::commonPrefix(QVersionNumber *v1,QVersionNumber *v2)

{
  long lVar1;
  int iVar2;
  longlong *plVar3;
  SegmentStorage *in_RSI;
  SegmentStorage in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype commonlen;
  QVersionNumber *result;
  QVersionNumber *in_stack_ffffffffffffff78;
  SegmentStorage *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  long local_40;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = segmentCount((QVersionNumber *)0x637cb2);
  local_18 = segmentCount((QVersionNumber *)0x637cc1);
  plVar3 = qMin<long_long>(&local_10,&local_18);
  lVar1 = *plVar3;
  for (local_40 = 0; local_40 < lVar1; local_40 = local_40 + 1) {
    in_stack_ffffffffffffff94 =
         segmentAt((QVersionNumber *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
    iVar2 = segmentAt((QVersionNumber *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
    if (in_stack_ffffffffffffff94 != iVar2) break;
  }
  if (local_40 == 0) {
    QVersionNumber((QVersionNumber *)0x637d53);
  }
  else {
    *(undefined1 **)in_RDI.field_0 = &DAT_aaaaaaaaaaaaaaaa;
    SegmentStorage::isUsingPointer(in_RSI);
    QVersionNumber((QVersionNumber *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    SegmentStorage::resize(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVersionNumber)in_RDI.field_0;
}

Assistant:

QVersionNumber QVersionNumber::commonPrefix(const QVersionNumber &v1,
                                            const QVersionNumber &v2)
{
    qsizetype commonlen = qMin(v1.segmentCount(), v2.segmentCount());
    qsizetype i;
    for (i = 0; i < commonlen; ++i) {
        if (v1.segmentAt(i) != v2.segmentAt(i))
            break;
    }

    if (i == 0)
        return QVersionNumber();

    // try to use the one with inline segments, if there's one
    QVersionNumber result(!v1.m_segments.isUsingPointer() ? v1 : v2);
    result.m_segments.resize(i);
    return result;
}